

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_NodeStoreEntry ** findSlot(UA_NodeStore *ns,UA_NodeId *nodeid)

{
  uint uVar1;
  UA_NodeStoreEntry **ppUVar2;
  UA_Boolean UVar3;
  UA_UInt32 UVar4;
  uint uVar5;
  UA_NodeStoreEntry *pUVar6;
  uint uVar7;
  ulong uVar8;
  
  UVar4 = UA_NodeId_hash(nodeid);
  uVar1 = ns->size;
  uVar8 = (ulong)UVar4 % (ulong)uVar1;
  ppUVar2 = ns->entries;
  pUVar6 = ppUVar2[uVar8];
  if ((UA_NodeStoreEntry *)0x1 < pUVar6) {
    do {
      UVar3 = UA_NodeId_equal(&(pUVar6->node).nodeId,nodeid);
      if (UVar3) {
        return (UA_NodeStoreEntry **)0x0;
      }
      uVar7 = (int)uVar8 + UVar4 % (uVar1 - 2) + 1;
      uVar5 = uVar1;
      if (uVar7 < uVar1) {
        uVar5 = 0;
      }
      uVar8 = (ulong)(uVar7 - uVar5);
      pUVar6 = ppUVar2[uVar8];
    } while ((UA_NodeStoreEntry *)0x1 < pUVar6);
  }
  return ppUVar2 + uVar8;
}

Assistant:

static UA_NodeStoreEntry **
findSlot(const UA_NodeStore *ns, const UA_NodeId *nodeid) {
    UA_UInt32 h = UA_NodeId_hash(nodeid);
    UA_UInt32 size = ns->size;
    UA_UInt32 idx = mod(h, size);
    UA_UInt32 hash2 = mod2(h, size);

    while(true) {
        UA_NodeStoreEntry *e = ns->entries[idx];
        if(e > UA_NODESTORE_TOMBSTONE &&
           UA_NodeId_equal(&e->node.nodeId, nodeid))
            return NULL;
        if(ns->entries[idx] <= UA_NODESTORE_TOMBSTONE)
            return &ns->entries[idx];
        idx += hash2;
        if(idx >= size)
            idx -= size;
    }

    /* NOTREACHED */
    return NULL;
}